

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O3

QDateTime __thiscall QFileSystemMetaData::fileTime(QFileSystemMetaData *this,FileTime time)

{
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  long lVar1;
  qint64 msecs;
  long in_FS_OFFSET;
  Data local_20;
  long local_18;
  
  lVar1 = CONCAT44(in_register_00000034,time);
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0:
    msecs = *(qint64 *)(lVar1 + 0x10);
    break;
  case 1:
    msecs = *(qint64 *)(lVar1 + 0x18);
    break;
  case 2:
    msecs = *(qint64 *)(lVar1 + 0x20);
    break;
  case 3:
    msecs = *(qint64 *)(lVar1 + 0x28);
    break;
  default:
    goto switchD_001190cf_default;
  }
  if (msecs == 0) {
switchD_001190cf_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
  }
  else {
    local_20 = (Data)0x2;
    QDateTime::fromMSecsSinceEpoch((QDateTime *)this,msecs,(QTimeZone *)&local_20.s);
    QTimeZone::~QTimeZone((QTimeZone *)&local_20.s);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (QDateTime)(Data)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QDateTime QFileSystemMetaData::fileTime(QFile::FileTime time) const
{
    switch (time) {
    case QFile::FileModificationTime:
        return modificationTime();

    case QFile::FileAccessTime:
        return accessTime();

    case QFile::FileBirthTime:
        return birthTime();

    case QFile::FileMetadataChangeTime:
        return metadataChangeTime();
    }

    return QDateTime();
}